

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlValidCtxtPtrWrap(xmlValidCtxtPtr valid)

{
  PyObject *ret;
  xmlValidCtxtPtr valid_local;
  
  if (valid == (xmlValidCtxtPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    valid_local = (xmlValidCtxtPtr)&_Py_NoneStruct;
  }
  else {
    valid_local = (xmlValidCtxtPtr)PyCapsule_New(valid,"xmlValidCtxtPtr",0);
  }
  return (PyObject *)valid_local;
}

Assistant:

PyObject *
libxml_xmlValidCtxtPtrWrap(xmlValidCtxtPtr valid)
{
	PyObject *ret;

#ifdef DEBUG
	printf("libxml_xmlValidCtxtPtrWrap: valid = %p\n", valid);
#endif
	if (valid == NULL) {
		Py_INCREF(Py_None);
		return (Py_None);
	}

	ret = 
		PyCapsule_New((void *) valid,
									 (char *) "xmlValidCtxtPtr", NULL);

	return (ret);
}